

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::setPermissions(int fd,Permissions permissions,QSystemError *error)

{
  mode_t __mode;
  int iVar1;
  uint *puVar2;
  
  __mode = QtPrivate::toMode_t(permissions);
  iVar1 = fchmod(fd,__mode);
  if (iVar1 != 0) {
    puVar2 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar2 | 0x100000000);
  }
  return iVar1 == 0;
}

Assistant:

bool QFileSystemEngine::setPermissions(int fd, QFile::Permissions permissions, QSystemError &error)
{
    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::fchmod(fd, mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}